

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlGlyphDefn.h
# Opt level: O0

void __thiscall GdlGlyphDefn::GdlGlyphDefn(GdlGlyphDefn *this,GlyphType glft,string *sta)

{
  GdlGlyphClassMember *in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  
  GdlGlyphClassMember::GdlGlyphClassMember(in_RDX);
  *in_RDI = &PTR__GdlGlyphDefn_0036a9e0;
  *(undefined4 *)((long)in_RDI + 0x34) = in_ESI;
  *(undefined4 *)(in_RDI + 7) = 0;
  *(undefined4 *)((long)in_RDI + 0x3c) = 0;
  *(undefined2 *)(in_RDI + 8) = 0;
  *(undefined4 *)((long)in_RDI + 0x44) = 0;
  in_RDI[9] = 0;
  std::__cxx11::string::string((string *)(in_RDI + 10),(string *)in_RDX);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x19db8e);
  std::vector<GlyphBoundaries,_std::allocator<GlyphBoundaries>_>::vector
            ((vector<GlyphBoundaries,_std::allocator<GlyphBoundaries>_> *)0x19db9e);
  *(undefined1 *)(in_RDI + 0x15) = 0;
  return;
}

Assistant:

GdlGlyphDefn(GlyphType glft, std::string sta)
		:	GdlGlyphClassMember(),
			m_glft(glft),
			m_nFirst(0),
			m_nLast(0),
			m_wCodePage(0),
			m_nUnicodeInput(0),
			m_pglfOutput(NULL),
			m_sta(sta),
			m_fGAResolved(false)
	{
		Assert(m_glft == kglftPostscript);
	}